

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_parse_sig_alg_ext(mbedtls_ssl_context *ssl,uchar *buf,uchar *end)

{
  uint16_t uVar1;
  ushort in;
  int iVar2;
  size_t need;
  uint8_t *end_00;
  char *pcVar3;
  char *pcVar4;
  uint local_48;
  uint32_t common_idx;
  uint16_t sig_alg;
  uchar *supported_sig_algs_end;
  size_t supported_sig_algs_len;
  uchar *p;
  uchar *end_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  local_48 = 0;
  iVar2 = mbedtls_ssl_chk_buf_ptr(buf,end,2);
  if (iVar2 == 0) {
    uVar1 = mbedtls_get_unaligned_uint16(buf);
    need = (size_t)(int)(uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    supported_sig_algs_len = (size_t)(buf + 2);
    memset(ssl->handshake->received_sig_algs,0,0x28);
    iVar2 = mbedtls_ssl_chk_buf_ptr((uint8_t *)supported_sig_algs_len,end,need);
    if (iVar2 == 0) {
      end_00 = (uint8_t *)(supported_sig_algs_len + need);
      while (supported_sig_algs_len < end_00) {
        iVar2 = mbedtls_ssl_chk_buf_ptr((uint8_t *)supported_sig_algs_len,end_00,2);
        if (iVar2 != 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1742,"missing input data in %s","mbedtls_ssl_parse_sig_alg_ext");
          mbedtls_ssl_pend_fatal_alert(ssl,'2',-0x7300);
          return -0x7300;
        }
        uVar1 = mbedtls_get_unaligned_uint16((void *)supported_sig_algs_len);
        in = uVar1 << 8 | uVar1 >> 8;
        supported_sig_algs_len = supported_sig_algs_len + 2;
        pcVar3 = mbedtls_ssl_sig_alg_to_str(in);
        mbedtls_debug_print_msg
                  (ssl,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1747,"received signature algorithm: 0x%x %s",(ulong)in,pcVar3);
        if ((ssl->tls_version != MBEDTLS_SSL_VERSION_TLS1_2) ||
           ((iVar2 = mbedtls_ssl_sig_alg_is_supported(ssl,in), iVar2 != 0 &&
            (iVar2 = mbedtls_ssl_sig_alg_is_offered(ssl,in), iVar2 != 0)))) {
          pcVar4 = mbedtls_ssl_sig_alg_to_str(in);
          mbedtls_debug_print_msg
                    (ssl,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1751,"valid signature algorithm: %s",pcVar4,pcVar3);
          if (local_48 + 1 < 0x14) {
            ssl->handshake->received_sig_algs[local_48] = in;
            local_48 = local_48 + 1;
          }
        }
      }
      if ((uchar *)supported_sig_algs_len == end) {
        if (local_48 == 0) {
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1762,"no signature algorithm in common");
          mbedtls_ssl_pend_fatal_alert(ssl,'(',-0x6e00);
          ssl_local._4_4_ = -0x6e00;
        }
        else {
          ssl->handshake->received_sig_algs[local_48] = 0;
          ssl_local._4_4_ = 0;
        }
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x175b,"Signature algorithms extension length misaligned");
        mbedtls_ssl_pend_fatal_alert(ssl,'2',-0x7300);
        ssl_local._4_4_ = -0x7300;
      }
    }
    else {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x173f,"missing input data in %s","mbedtls_ssl_parse_sig_alg_ext");
      mbedtls_ssl_pend_fatal_alert(ssl,'2',-0x7300);
      ssl_local._4_4_ = -0x7300;
    }
  }
  else {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1738,"missing input data in %s","mbedtls_ssl_parse_sig_alg_ext");
    mbedtls_ssl_pend_fatal_alert(ssl,'2',-0x7300);
    ssl_local._4_4_ = -0x7300;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_parse_sig_alg_ext(mbedtls_ssl_context *ssl,
                                  const unsigned char *buf,
                                  const unsigned char *end)
{
    const unsigned char *p = buf;
    size_t supported_sig_algs_len = 0;
    const unsigned char *supported_sig_algs_end;
    uint16_t sig_alg;
    uint32_t common_idx = 0;

    MBEDTLS_SSL_CHK_BUF_READ_PTR(p, end, 2);
    supported_sig_algs_len = MBEDTLS_GET_UINT16_BE(p, 0);
    p += 2;

    memset(ssl->handshake->received_sig_algs, 0,
           sizeof(ssl->handshake->received_sig_algs));

    MBEDTLS_SSL_CHK_BUF_READ_PTR(p, end, supported_sig_algs_len);
    supported_sig_algs_end = p + supported_sig_algs_len;
    while (p < supported_sig_algs_end) {
        MBEDTLS_SSL_CHK_BUF_READ_PTR(p, supported_sig_algs_end, 2);
        sig_alg = MBEDTLS_GET_UINT16_BE(p, 0);
        p += 2;
        MBEDTLS_SSL_DEBUG_MSG(4, ("received signature algorithm: 0x%x %s",
                                  sig_alg,
                                  mbedtls_ssl_sig_alg_to_str(sig_alg)));
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2 &&
            (!(mbedtls_ssl_sig_alg_is_supported(ssl, sig_alg) &&
               mbedtls_ssl_sig_alg_is_offered(ssl, sig_alg)))) {
            continue;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

        MBEDTLS_SSL_DEBUG_MSG(4, ("valid signature algorithm: %s",
                                  mbedtls_ssl_sig_alg_to_str(sig_alg)));

        if (common_idx + 1 < MBEDTLS_RECEIVED_SIG_ALGS_SIZE) {
            ssl->handshake->received_sig_algs[common_idx] = sig_alg;
            common_idx += 1;
        }
    }
    /* Check that we consumed all the message. */
    if (p != end) {
        MBEDTLS_SSL_DEBUG_MSG(1,
                              ("Signature algorithms extension length misaligned"));
        MBEDTLS_SSL_PEND_FATAL_ALERT(MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR,
                                     MBEDTLS_ERR_SSL_DECODE_ERROR);
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    if (common_idx == 0) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("no signature algorithm in common"));
        MBEDTLS_SSL_PEND_FATAL_ALERT(MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE,
                                     MBEDTLS_ERR_SSL_HANDSHAKE_FAILURE);
        return MBEDTLS_ERR_SSL_HANDSHAKE_FAILURE;
    }

    ssl->handshake->received_sig_algs[common_idx] = MBEDTLS_TLS_SIG_NONE;
    return 0;
}